

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

string * __thiscall
vkt::tessellation::getTessellationLevelsString_abi_cxx11_
          (string *__return_storage_ptr__,tessellation *this,TessLevels *tessLevels,
          TessPrimitiveType primitiveType)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  ostringstream str;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar2 = (int)tessLevels;
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"inner: { ",9);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," }, ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"outer: { ",9);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 0xc));
    lVar3 = 0x10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  else if (iVar2 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"inner: { ",9);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," }, ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"outer: { ",9);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 0xc));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 0x10));
    lVar3 = 0x14;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  else {
    if (iVar2 != 2) goto LAB_007daa57;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"inner: { }, ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"outer: { ",9);
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 8));
    lVar3 = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + lVar3));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
LAB_007daa57:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string getTessellationLevelsString (const TessLevels& tessLevels, const TessPrimitiveType primitiveType)
{
	std::ostringstream str;
	switch (primitiveType)
	{
		case TESSPRIMITIVETYPE_ISOLINES:
			str << "inner: { }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << " }";
			break;

		case TESSPRIMITIVETYPE_TRIANGLES:
			str << "inner: { " << tessLevels.inner[0] << " }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << ", " << tessLevels.outer[2] << " }";
			break;

		case TESSPRIMITIVETYPE_QUADS:
			str << "inner: { " << tessLevels.inner[0] << ", " << tessLevels.inner[1] << " }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << ", " << tessLevels.outer[2] << ", " << tessLevels.outer[3] << " }";
			break;

		default:
			DE_ASSERT(false);
	}

	return str.str();
}